

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuFuzzyImageCompare.cpp
# Opt level: O0

deUint32 tcu::readUnorm8<3>(ConstPixelBufferAccess *src,int x,int y)

{
  int iVar1;
  void *pvVar2;
  int local_28;
  uint local_24;
  int c;
  deUint32 v;
  deUint8 *ptr;
  int y_local;
  int x_local;
  ConstPixelBufferAccess *src_local;
  
  pvVar2 = ConstPixelBufferAccess::getDataPtr(src);
  iVar1 = ConstPixelBufferAccess::getRowPitch(src);
  local_24 = 0;
  for (local_28 = 0; local_28 < 3; local_28 = local_28 + 1) {
    local_24 = (uint)*(byte *)((long)pvVar2 + (long)local_28 + (long)(x * 3) + (long)(iVar1 * y)) <<
               ((byte)(local_28 << 3) & 0x1f) | local_24;
  }
  return local_24 | 0xff000000;
}

Assistant:

static inline deUint32 readUnorm8 (const tcu::ConstPixelBufferAccess& src, int x, int y)
{
	const deUint8*	ptr	= (const deUint8*)src.getDataPtr() + src.getRowPitch()*y + x*NumChannels;
	deUint32		v	= 0;

	for (int c = 0; c < NumChannels; c++)
		v |= ptr[c] << (c*8);

	if (NumChannels < 4)
		v |= 0xffu << 24;

	return v;
}